

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

void cmsys::SystemTools::AddKeepPath(string *dir)

{
  size_type sVar1;
  int *piVar2;
  char *__s;
  string cdir;
  char resolved_name [4096];
  allocator local_1089;
  string local_1088;
  long *local_1068 [2];
  long local_1058 [2];
  string local_1048;
  char local_1028 [4096];
  
  local_1088._M_string_length = 0;
  local_1088.field_2._M_local_buf[0] = '\0';
  local_1088._M_dataplus._M_p = (pointer)&local_1088.field_2;
  CollapseFullPath(&local_1048,dir,(char *)0x0);
  std::__cxx11::string::string((string *)local_1068,local_1048._M_dataplus._M_p,&local_1089);
  piVar2 = __errno_location();
  *piVar2 = 0;
  __s = realpath((char *)local_1068[0],local_1028);
  sVar1 = local_1088._M_string_length;
  if (__s == (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_1088);
  }
  else {
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_1088,0,(char *)sVar1,(ulong)__s);
  }
  if (local_1068[0] != local_1058) {
    operator_delete(local_1068[0],local_1058[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1048._M_dataplus._M_p != &local_1048.field_2) {
    operator_delete(local_1048._M_dataplus._M_p,local_1048.field_2._M_allocated_capacity + 1);
  }
  AddTranslationPath(&local_1088,dir);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1088._M_dataplus._M_p != &local_1088.field_2) {
    operator_delete(local_1088._M_dataplus._M_p,
                    CONCAT71(local_1088.field_2._M_allocated_capacity._1_7_,
                             local_1088.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void SystemTools::AddKeepPath(const std::string& dir)
{
  std::string cdir;
  Realpath(SystemTools::CollapseFullPath(dir).c_str(), cdir);
  SystemTools::AddTranslationPath(cdir, dir);
}